

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long firstSequenceLength_00;
  int iVar1;
  long lVar2;
  double *counts;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  char automatonState;
  long firstSequenceLength;
  ulong local_70;
  args_t args;
  Vector copy_count;
  
  argparse::args_t::args_t(&args,argc,argv);
  initAlphabets(args.data == protein,(char *)0x0,false);
  automatonState = '\0';
  Vector::Vector(&copy_count);
  Vector::appendValue(&copy_count,0);
  firstSequenceLength = 0;
  local_70 = (ulong)(args.data != dna) << 4 | 4;
  iVar1 = 2;
  counts = (double *)0x0;
  lVar6 = 0;
  do {
    if ((char)iVar1 != '\x02') {
      if (args.quiet == false) {
        poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        poVar4 = std::operator<<(poVar4,"{\"unique\" : ");
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        poVar4 = std::operator<<(poVar4," , \"total\" : ");
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        poVar4 = std::operator<<(poVar4,"}");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      exportJSON(args.output,firstSequenceLength,local_70,counts,args.data == protein);
      iVar1 = 0;
      if (counts != (double *)0x0) {
        operator_delete__(counts);
        iVar1 = 0;
      }
LAB_00103ac1:
      Vector::~Vector(&copy_count);
      argparse::args_t::~args_t(&args);
      return iVar1;
    }
    iVar1 = readFASTA(args.input,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                      &firstSequenceLength,true,&copy_count,args.counts_in_name,1.0,false);
    if ((char)iVar1 == '\x01') {
      iVar1 = 1;
      goto LAB_00103ac1;
    }
    if (lVar6 == 0) {
      uVar5 = firstSequenceLength * local_70;
      counts = (double *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
      if ((long)uVar5 < 1) {
        uVar5 = 0;
      }
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        counts[uVar3] = 0.0;
      }
    }
    firstSequenceLength_00 = firstSequenceLength;
    if (args.data == protein) {
      lVar2 = Vector::value(&copy_count,0);
      handle_a_sequence_aa(&sequences,counts,firstSequenceLength_00,lVar2,args.ambig == skipover);
    }
    else {
      lVar2 = Vector::value(&copy_count,0);
      handle_a_sequence(&sequences,counts,firstSequenceLength_00,lVar2,args.ambig == skipover);
    }
    Vector::value(&copy_count,0);
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

int main (int argc, const char * argv[]) {

    args_t args = args_t (argc, argv);
    initAlphabets(args.data == protein);

    char automatonState = 0,
         fasta_result = 2;
    // 0 - between sequences
    // 1 - reading sequence name
    // 2 - reading sequence
    
    double * freq_counts = NULL;
    Vector copy_count;
    copy_count.appendValue(0);

 
    long sequences_read = 0L,
         sequence_copies = 0L,
         firstSequenceLength = 0L,
         dim = (args.data == dna) ? 4L: 20L;
          
    while (fasta_result == 2) {
        
        fasta_result = readFASTA (args.input, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength, true, &copy_count, args.counts_in_name);
        if (fasta_result == 1) {
            return 1;
        }
        if (sequences_read == 0) {
            freq_counts = new double [dim*firstSequenceLength];
            for (long k = 0; k < dim*firstSequenceLength; k++) freq_counts [k] = 0.;
        }
        
        if (args.data == protein) 
          handle_a_sequence_aa (sequences, freq_counts, firstSequenceLength, copy_count.value(0), args.ambig == skipover);
        else
          handle_a_sequence (sequences, freq_counts, firstSequenceLength, copy_count.value(0), args.ambig == skipover);
        sequences_read ++;
        sequence_copies += copy_count.value(0);
        /*if (args.quiet == false && sequences_read % 1000 == 0) {
            cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b" << setw(8) << sequences_read << " reads";
        }*/

    }
  
    if (args.quiet == false) {
      cerr << endl << "{\"unique\" : " << sequences_read << " , \"total\" : " << sequence_copies << "}" << endl;
    }
    
    /*if (args.quiet == false) {
      cerr << endl;
    }*/
    
    exportJSON (args.output, firstSequenceLength, dim, freq_counts, args.data == protein);
    if (freq_counts) delete [] freq_counts;
    
    return 0;

}